

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O1

void uv_loop_delete(uv_loop_t *loop)

{
  uv_mutex_t *mutex;
  
  uv__signal_loop_cleanup(loop);
  uv__platform_loop_delete(loop);
  uv__async_stop(loop,&loop->async_watcher);
  if (loop->emfile_fd != -1) {
    uv__close(loop->emfile_fd);
    loop->emfile_fd = -1;
  }
  if (loop->backend_fd != -1) {
    uv__close(loop->backend_fd);
    loop->backend_fd = -1;
  }
  mutex = &loop->wq_mutex;
  uv_mutex_lock(mutex);
  if (loop->wq != (void **)loop->wq[0]) {
    __assert_fail("QUEUE_EMPTY(&loop->wq) && \"thread pool work queue not empty!\"",
                  "src/unix/loop.c",0x95,"void uv__loop_delete(uv_loop_t *)");
  }
  if (loop->active_reqs != (void **)loop->active_reqs[0]) {
    __assert_fail("!uv__has_active_reqs(loop)","src/unix/loop.c",0x96,
                  "void uv__loop_delete(uv_loop_t *)");
  }
  uv_mutex_unlock(mutex);
  uv_mutex_destroy(mutex);
  free(loop->watchers);
  loop->watchers = (uv__io_t **)0x0;
  loop->nwatchers = 0;
  memset(loop,0xff,0x2d0);
  if (default_loop_ptr != loop) {
    free(loop);
    return;
  }
  default_loop_ptr = (uv_loop_t *)0x0;
  return;
}

Assistant:

void uv_loop_delete(uv_loop_t* loop) {
  uv__loop_delete(loop);
#ifndef NDEBUG
  memset(loop, -1, sizeof(*loop));
#endif
  if (loop == default_loop_ptr)
    default_loop_ptr = NULL;
  else
    free(loop);
}